

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::Directory::openSubdir(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *extraout_RDX_01;
  Directory *extraout_RDX_02;
  Directory *extraout_RDX_03;
  Directory *pDVar1;
  uint in_R8D;
  Own<kj::Directory,_std::nullptr_t> OVar2;
  Own<const_kj::Directory,_std::nullptr_t> OVar3;
  Fault f;
  _func_int **local_38;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x88))(&f);
  if (local_38 == (_func_int **)0x0) {
    if ((in_R8D & 3) == 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x266,FAILED,(char *)0x0,"\"directory already exists\", path",
                 (char (*) [25])"directory already exists",&path_local);
      _::Debug::Fault::~Fault(&f);
      pDVar1 = extraout_RDX_00;
    }
    else if ((in_R8D & 3) == 2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x268,FAILED,(char *)0x0,"\"directory does not exist\", path",
                 (char (*) [25])"directory does not exist",&path_local);
      _::Debug::Fault::~Fault(&f);
      pDVar1 = extraout_RDX_01;
    }
    else if ((in_R8D & 3) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x26a,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
      _::Debug::Fault::~Fault(&f);
      pDVar1 = extraout_RDX_03;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x26d,FAILED,(char *)0x0,
                 "\"tryOpenSubdir() returned null despite no preconditions\", path",
                 (char (*) [55])"tryOpenSubdir() returned null despite no preconditions",&path_local
                );
      _::Debug::Fault::~Fault(&f);
      pDVar1 = extraout_RDX_02;
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = local_38;
    pDVar1 = extraout_RDX;
  }
  if (local_38 == (_func_int **)0x0) {
    clock = nullClock();
    OVar2 = newInMemoryDirectory
                      ((kj *)&f,clock,
                       &defaultInMemoryFileFactory::instance.super_InMemoryFileFactory);
    pDVar1 = OVar2.ptr;
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
  }
  OVar3.ptr = pDVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const Directory> Directory::openSubdir(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryOpenSubdir(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("directory already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("directory does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenSubdir() returned null despite no preconditions", path) { break; }